

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int rd_contents_init(archive_read *a,enctype encoding,int a_sum_alg,int e_sum_alg)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  
  pvVar1 = a->format->data;
  *(enctype *)((long)pvVar1 + 0x60) = encoding;
  if (encoding - LZMA < 2) {
    if (*(int *)((long)pvVar1 + 0x168) != 0) {
      lzma_end((long)pvVar1 + 0xe0);
      *(undefined4 *)((long)pvVar1 + 0x168) = 0;
    }
    if (*(int *)((long)pvVar1 + 0x1f8) == 4) {
      iVar2 = lzma_stream_decoder((long)pvVar1 + 0xe0,0xffffffffffffffff,8);
    }
    else {
      iVar2 = lzma_alone_decoder((long)pvVar1 + 0xe0,0xffffffffffffffff);
    }
    if (iVar2 == 0) {
      puVar4 = (undefined4 *)((long)pvVar1 + 0x168);
      lVar5 = 0x108;
      lVar6 = 0xf0;
LAB_00139b87:
      *puVar4 = 1;
      *(undefined8 *)((long)pvVar1 + lVar6) = 0;
      *(undefined8 *)((long)pvVar1 + lVar5) = 0;
LAB_00139b97:
      pvVar1 = a->format->data;
      _checksum_init((chksumwork *)((long)pvVar1 + 0x170),a_sum_alg);
      _checksum_init((chksumwork *)((long)pvVar1 + 0x188),e_sum_alg);
      return 0;
    }
    if (iVar2 == 8) {
      pcVar7 = "Internal error initializing compression library: Invalid or unsupported options";
    }
    else {
      if (iVar2 == 5) {
        pcVar7 = "Internal error initializing compression library: Cannot allocate memory";
        iVar2 = 0xc;
        goto LAB_00139b68;
      }
      pcVar7 = "Internal error initializing lzma library";
    }
  }
  else {
    if (encoding == NONE) goto LAB_00139b97;
    if (encoding != GZIP) {
      uVar3 = *(int *)((long)pvVar1 + 0x1f8) - 2;
      if (uVar3 < 3) {
        pcVar7 = &DAT_0017c070 + *(int *)(&DAT_0017c070 + (ulong)uVar3 * 4);
      }
      else {
        pcVar7 = "??";
      }
      archive_set_error(&a->archive,-1,"%s compression not supported on this platform",pcVar7);
      return -0x19;
    }
    if (*(int *)((long)pvVar1 + 0xd8) == 0) {
      iVar2 = inflateInit_((long)pvVar1 + 0x68,"1.2.11",0x70);
    }
    else {
      iVar2 = inflateReset();
    }
    if (iVar2 == 0) {
      puVar4 = (undefined4 *)((long)pvVar1 + 0xd8);
      lVar5 = 0x90;
      lVar6 = 0x78;
      goto LAB_00139b87;
    }
    pcVar7 = "Couldn\'t initialize zlib stream.";
  }
  iVar2 = -1;
LAB_00139b68:
  archive_set_error(&a->archive,iVar2,pcVar7);
  return -0x1e;
}

Assistant:

static int
rd_contents_init(struct archive_read *a, enum enctype encoding,
    int a_sum_alg, int e_sum_alg)
{
	int r;

	/* Init decompress library. */
	if ((r = decompression_init(a, encoding)) != ARCHIVE_OK)
		return (r);
	/* Init checksum library. */
	checksum_init(a, a_sum_alg, e_sum_alg);
	return (ARCHIVE_OK);
}